

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_long_fs.c
# Opt level: O0

int check_long_fs(test_state *state)

{
  int iVar1;
  int iVar2;
  undefined8 *in_RDI;
  int bs;
  int i;
  int size;
  int status;
  int local_1c;
  int local_4;
  
  iVar1 = *(int *)((long)in_RDI + 0xc);
  iVar2 = *(int *)(in_RDI[0xb] + 0x34);
  for (local_1c = 0; local_1c < iVar2 / 2; local_1c = local_1c + 1) {
    (*(code *)in_RDI[10])(in_RDI[2] + (long)(iVar1 * local_1c),in_RDI[9],iVar1);
    (*(code *)in_RDI[10])
              (in_RDI[2] + (long)((iVar2 * iVar1) / 2) + (long)(iVar1 * local_1c),65000,iVar1);
  }
  printf("Checking long fs ... ");
  local_4 = (*(code *)*in_RDI)(in_RDI);
  if (local_4 == 0) {
    printf("%s\n","\x1b[0;32mPASS\x1b[0m");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int check_long_fs(struct test_state *state)
{
    int status, size, i, bs;

    size = state->bytes_per_sample;
    bs = state->strm->block_size;

    for (i = 0; i < bs / 2; i++) {
        state->out(state->ubuf + size * i, state->xmin, size);
        state->out(state->ubuf + bs * size / 2 + size * i, 65000, size);
    }

    printf("Checking long fs ... ");

    status = state->codec(state);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}